

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O0

ptr<resp_msg> __thiscall nuraft::raft_server::handle_add_srv_req(raft_server *this,req_msg *req)

{
  ulong uVar1;
  log_val_type lVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  srv_role sVar6;
  int32 iVar7;
  uint uVar8;
  __int_type_conflict _Var9;
  size_type sVar10;
  element_type *this_00;
  element_type *peVar11;
  element_type *peVar12;
  element_type *peVar13;
  uint64_t uVar14;
  element_type *peVar15;
  shared_ptr<nuraft::srv_config> *args;
  element_type *peVar16;
  socklen_t *__addr_len;
  req_msg *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  sockaddr *__addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  long in_RSI;
  element_type *in_RDI;
  ptr<resp_msg> pVar18;
  executor exec;
  ulong last_active_ms;
  ptr<srv_config> srv_conf;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *entries;
  ptr<resp_msg> *resp;
  _Placeholder<1> *in_stack_fffffffffffffd58;
  raft_server *in_stack_fffffffffffffd60;
  function<void_(int)> *in_stack_fffffffffffffd68;
  context *in_stack_fffffffffffffd70;
  context *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  raft_server *in_stack_fffffffffffffe78;
  socklen_t local_170 [8];
  string local_150 [48];
  string local_120 [32];
  ulong local_100;
  string local_f8 [32];
  string local_d8 [32];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_b8;
  int32 local_ac;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_a8 [3];
  string local_90 [36];
  undefined4 local_6c;
  string local_68 [52];
  undefined4 local_34;
  ulong local_30;
  byte local_21;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *local_20;
  
  local_20 = req_msg::log_entries(in_RDX);
  local_21 = 0;
  std::__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x4802b3);
  local_30 = srv_state::get_term((srv_state *)0x4802bb);
  local_34 = 7;
  cs_new<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,std::atomic<int>&>
            ((unsigned_long *)in_stack_fffffffffffffd78,(msg_type *)in_stack_fffffffffffffd70,
             (int *)in_stack_fffffffffffffd68,(atomic<int> *)in_stack_fffffffffffffd60);
  sVar10 = std::
           vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
           ::size(local_20);
  if (sVar10 == 1) {
    std::
    vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
    ::operator[](local_20,0);
    this_00 = std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x48032a);
    lVar2 = log_entry::get_val_type(this_00);
    if (lVar2 == cluster_server) {
      sVar6 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x4804a2);
      if ((sVar6 != leader) ||
         (bVar3 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffd68),
         bVar3)) {
        bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
        if (bVar3) {
          peVar11 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x4804f5);
          iVar5 = (**(code **)(*(long *)peVar11 + 0x38))();
          if (1 < iVar5) {
            peVar11 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x48052e);
            msg_if_given_abi_cxx11_
                      ((char *)local_90,"this is not a leader, cannot handle AddServerRequest");
            (**(code **)(*(long *)peVar11 + 0x40))
                      (peVar11,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                       ,"handle_add_srv_req",0x36,local_90);
            std::__cxx11::string::~string(local_90);
          }
        }
        peVar12 = std::
                  __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x4805c4);
        resp_msg::set_result_code(peVar12,NOT_LEADER);
        local_21 = 1;
        local_6c = 1;
        _Var17._M_pi = extraout_RDX_00;
        goto LAB_00480ec9;
      }
      check_srv_to_leave_timeout
                ((raft_server *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      std::
      vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ::operator[](local_20,0);
      std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x480613);
      log_entry::get_buf((log_entry *)in_stack_fffffffffffffd70);
      srv_config::deserialize((buffer *)in_stack_fffffffffffffd78);
      peVar13 = std::
                __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x48065f);
      local_ac = srv_config::get_id(peVar13);
      local_a8[0]._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
           ::find((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                   *)in_stack_fffffffffffffd58,(key_type *)0x480693);
      local_b8._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
           ::end((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                  *)in_stack_fffffffffffffd58);
      bVar4 = std::__detail::operator!=(local_a8,&local_b8);
      bVar3 = true;
      if (!bVar4) {
        iVar5 = *(int *)(in_RSI + 0x38);
        peVar13 = std::
                  __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x48070d);
        iVar7 = srv_config::get_id(peVar13);
        bVar3 = iVar5 == iVar7;
      }
      if (bVar3) {
        bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
        if (bVar3) {
          peVar11 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x480779);
          iVar5 = (**(code **)(*(long *)peVar11 + 0x38))();
          if (2 < iVar5) {
            peVar11 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x4807b2);
            peVar13 = std::
                      __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x4807c7);
            uVar8 = srv_config::get_id(peVar13);
            msg_if_given_abi_cxx11_
                      ((char *)local_d8,
                       "the server to be added has a duplicated id with existing server %d",
                       (ulong)uVar8);
            (**(code **)(*(long *)peVar11 + 0x40))
                      (peVar11,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                       ,"handle_add_srv_req",0x43,local_d8);
            std::__cxx11::string::~string(local_d8);
          }
        }
        peVar12 = std::
                  __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x480886);
        resp_msg::set_result_code(peVar12,SERVER_ALREADY_EXISTS);
        local_21 = 1;
        local_6c = 1;
      }
      else if ((*(byte *)(in_RSI + 0xe9) & 1) == 0) {
        bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x3a0));
        if (bVar3) {
          std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x480a0e);
          uVar14 = peer::get_active_timer_us((peer *)0x480a16);
          local_100 = uVar14 / 1000;
          bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
          if (bVar3) {
            peVar11 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x480a65);
            iVar5 = (**(code **)(*(long *)peVar11 + 0x38))();
            if (2 < iVar5) {
              peVar11 = std::
                        __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x480a98);
              std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x480ab1);
              uVar8 = peer::get_id((peer *)0x480ab9);
              msg_if_given_abi_cxx11_
                        ((char *)local_120,
                         "previous adding server (%d) is in progress, last activity: %lu ms ago",
                         (ulong)uVar8,local_100);
              (**(code **)(*(long *)peVar11 + 0x40))
                        (peVar11,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                         ,"handle_add_srv_req",0x57,local_120);
              std::__cxx11::string::~string(local_120);
            }
          }
          uVar1 = local_100;
          _Var9 = std::__atomic_base::operator_cast_to_int
                            ((__atomic_base<int> *)in_stack_fffffffffffffd68);
          std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                    ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x480b81)
          ;
          nuraft::context::get_params(in_stack_fffffffffffffd78);
          peVar15 = std::
                    __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x480ba0);
          iVar5 = *(int *)(peVar15 + 8);
          std::shared_ptr<nuraft::raft_params>::~shared_ptr
                    ((shared_ptr<nuraft::raft_params> *)0x480bc2);
          if (uVar1 <= (ulong)((long)_Var9 * (long)iVar5)) {
            peVar12 = std::
                      __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x480bde);
            resp_msg::set_result_code(peVar12,SERVER_IS_JOINING);
            local_21 = 1;
            local_6c = 1;
            goto LAB_00480eab;
          }
          bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
          if (bVar3) {
            peVar11 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x480c36);
            iVar5 = (**(code **)(*(long *)peVar11 + 0x38))();
            if (2 < iVar5) {
              peVar11 = std::
                        __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x480c69);
              msg_if_given_abi_cxx11_
                        ((char *)local_150,"activity timeout (last activity %lu ms ago), start over"
                         ,local_100);
              (**(code **)(*(long *)peVar11 + 0x40))
                        (peVar11,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                         ,"handle_add_srv_req",0x61,local_150);
              std::__cxx11::string::~string(local_150);
            }
          }
          reset_srv_to_join(in_stack_fffffffffffffd60);
        }
        std::shared_ptr<nuraft::srv_config>::operator=
                  ((shared_ptr<nuraft::srv_config> *)in_stack_fffffffffffffd60,
                   (shared_ptr<nuraft::srv_config> *)in_stack_fffffffffffffd58);
        std::bind<void(nuraft::raft_server::*)(int),nuraft::raft_server*,std::_Placeholder<1>const&>
                  ((offset_in_raft_server_to_subr *)in_stack_fffffffffffffd68,
                   (raft_server **)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        std::function<void(int)>::
        function<std::_Bind<void(nuraft::raft_server::*(nuraft::raft_server*,std::_Placeholder<1>))(int)>,void>
                  ((function<void_(int)> *)in_stack_fffffffffffffd70,
                   (_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::_Placeholder<1>))(int)>
                    *)in_stack_fffffffffffffd68);
        args = (shared_ptr<nuraft::srv_config> *)(in_RSI + 0x3d0);
        std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator*
                  ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)
                   in_stack_fffffffffffffd60);
        __addr_len = local_170;
        cs_new<nuraft::peer,std::shared_ptr<nuraft::srv_config>&,nuraft::context&,std::function<void(int)>&,std::shared_ptr<nuraft::logger>&>
                  (args,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                   (shared_ptr<nuraft::logger> *)in_stack_fffffffffffffd60);
        std::shared_ptr<nuraft::peer>::operator=
                  ((shared_ptr<nuraft::peer> *)in_stack_fffffffffffffd60,
                   (shared_ptr<nuraft::peer> *)in_stack_fffffffffffffd58);
        std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x480e0d);
        invite_srv_to_join_cluster(in_stack_fffffffffffffe78);
        peVar12 = std::
                  __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x480e29);
        peVar16 = std::
                  __shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x480e42);
        iVar5 = (**(code **)(*(long *)peVar16 + 0x10))();
        resp_msg::accept(peVar12,iVar5,__addr,__addr_len);
        local_21 = 1;
        local_6c = 1;
        std::function<void_(int)>::~function((function<void_(int)> *)0x480e86);
      }
      else {
        bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
        if (bVar3) {
          peVar11 = std::
                    __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x4808f3);
          iVar5 = (**(code **)(*(long *)peVar11 + 0x38))();
          if (2 < iVar5) {
            peVar11 = std::
                      __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x480926);
            msg_if_given_abi_cxx11_((char *)local_f8,"previous config has not committed yet");
            (**(code **)(*(long *)peVar11 + 0x40))
                      (peVar11,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                       ,"handle_add_srv_req",0x4a,local_f8);
            std::__cxx11::string::~string(local_f8);
          }
        }
        peVar12 = std::
                  __shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x4809b6);
        resp_msg::set_result_code(peVar12,CONFIG_CHANGING);
        local_21 = 1;
        local_6c = 1;
      }
LAB_00480eab:
      std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x480eb8);
      _Var17._M_pi = extraout_RDX_01;
      goto LAB_00480ec9;
    }
  }
  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
  if (bVar3) {
    peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x48037f);
    iVar5 = (**(code **)(*(long *)peVar11 + 0x38))();
    if (4 < iVar5) {
      peVar11 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x4803b8);
      msg_if_given_abi_cxx11_
                ((char *)local_68,
                 "bad add server request as we are expecting one log entry with value type of ClusterServer"
                );
      (**(code **)(*(long *)peVar11 + 0x40))
                (peVar11,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                 ,"handle_add_srv_req",0x30,local_68);
      std::__cxx11::string::~string(local_68);
    }
  }
  peVar12 = std::__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x480467);
  resp_msg::set_result_code(peVar12,BAD_REQUEST);
  local_21 = 1;
  local_6c = 1;
  _Var17._M_pi = extraout_RDX;
LAB_00480ec9:
  if ((local_21 & 1) == 0) {
    std::shared_ptr<nuraft::resp_msg>::~shared_ptr((shared_ptr<nuraft::resp_msg> *)0x480ee0);
    _Var17._M_pi = extraout_RDX_02;
  }
  pVar18.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var17._M_pi;
  pVar18.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar18.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_add_srv_req(req_msg& req) {
    std::vector< ptr<log_entry> >& entries = req.log_entries();
    ptr<resp_msg> resp = cs_new<resp_msg>
                         ( state_->get_term(),
                           msg_type::add_server_response,
                           id_,
                           leader_ );

    if ( entries.size() != 1 ||
         entries[0]->get_val_type() != log_val_type::cluster_server ) {
        p_db( "bad add server request as we are expecting one log entry "
              "with value type of ClusterServer" );
        resp->set_result_code(cmd_result_code::BAD_REQUEST);
        return resp;
    }

    if (role_ != srv_role::leader || write_paused_) {
        p_er("this is not a leader, cannot handle AddServerRequest");
        resp->set_result_code(cmd_result_code::NOT_LEADER);
        return resp;
    }

    // Before checking duplicate ID, confirm srv_to_leave_ is gone.
    check_srv_to_leave_timeout();
    ptr<srv_config> srv_conf =
        srv_config::deserialize( entries[0]->get_buf() );
    if ( peers_.find( srv_conf->get_id() ) != peers_.end() ||
         id_ == srv_conf->get_id() ) {
        p_wn( "the server to be added has a duplicated "
              "id with existing server %d",
              srv_conf->get_id() );
        resp->set_result_code(cmd_result_code::SERVER_ALREADY_EXISTS);
        return resp;
    }

    if (config_changing_) {
        // the previous config has not committed yet
        p_wn("previous config has not committed yet");
        resp->set_result_code(cmd_result_code::CONFIG_CHANGING);
        return resp;
    }

    if (srv_to_join_) {
        // Adding server is already in progress.

        // Check the last active time of that server.
        ulong last_active_ms = srv_to_join_->get_active_timer_us() / 1000;
        p_wn("previous adding server (%d) is in progress, "
             "last activity: %" PRIu64 " ms ago",
             srv_to_join_->get_id(),
             last_active_ms);

        if ( last_active_ms <=
                 (ulong)raft_server::raft_limits_.response_limit_ *
                 ctx_->get_params()->heart_beat_interval_ ) {
            resp->set_result_code(cmd_result_code::SERVER_IS_JOINING);
            return resp;
        }
        // Otherwise: activity timeout, reset the server.
        p_wn("activity timeout (last activity %" PRIu64 " ms ago), start over",
             last_active_ms);
        reset_srv_to_join();
    }

    conf_to_add_ = std::move(srv_conf);
    timer_task<int32>::executor exec =
        (timer_task<int32>::executor)
        std::bind( &raft_server::handle_hb_timeout,
                   this,
                   std::placeholders::_1 );
    srv_to_join_ = cs_new< peer,
                           ptr<srv_config>&,
                           context&,
                           timer_task<int32>::executor&,
                           ptr<logger>& >
                         ( conf_to_add_, *ctx_, exec, l_ );
    invite_srv_to_join_cluster();
    resp->accept(log_store_->next_slot());
    return resp;
}